

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteGeometry(ColladaExporter *this,size_t pIndex)

{
  undefined1 *puVar1;
  string *psVar2;
  string *psVar3;
  aiMesh *paVar4;
  aiFace *paVar5;
  uint uVar6;
  ostream *poVar7;
  long lVar8;
  int iVar9;
  unsigned_long uVar10;
  int iVar11;
  size_t b;
  ulong uVar12;
  ulong uVar13;
  size_t a;
  size_t a_2;
  ulong uVar14;
  string geometryId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string idstr;
  string geometryName;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar4 = this->mScene->mMeshes[pIndex];
  if ((paVar4->mName).length == 0) {
    GetMeshId_abi_cxx11_(&idstr,this,pIndex);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&idstr,(paVar4->mName).data,(allocator<char> *)&geometryName);
  }
  XMLEscape(&geometryName,&idstr);
  XMLIDEncode(&geometryId,&idstr);
  if ((paVar4->mNumFaces != 0) && (paVar4->mNumVertices != 0)) {
    puVar1 = &this->field_0x38;
    psVar2 = &this->startstr;
    poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar7 = std::operator<<(poVar7,"<geometry id=\"");
    poVar7 = std::operator<<(poVar7,(string *)&geometryId);
    poVar7 = std::operator<<(poVar7,"\" name=\"");
    poVar7 = std::operator<<(poVar7,(string *)&geometryName);
    poVar7 = std::operator<<(poVar7,"\" >");
    psVar3 = &this->endstr;
    std::operator<<(poVar7,(string *)psVar3);
    PushTag(this);
    poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar7 = std::operator<<(poVar7,"<mesh>");
    std::operator<<(poVar7,(string *)psVar3);
    PushTag(this);
    std::operator+(&local_d8,&idstr,"-positions");
    WriteFloatArray(this,&local_d8,FloatType_Vector,&paVar4->mVertices->x,
                    (ulong)paVar4->mNumVertices);
    std::__cxx11::string::~string((string *)&local_d8);
    if ((paVar4->mNormals != (aiVector3D *)0x0) && (paVar4->mNumVertices != 0)) {
      std::operator+(&local_d8,&idstr,"-normals");
      WriteFloatArray(this,&local_d8,FloatType_Vector,&paVar4->mNormals->x,
                      (ulong)paVar4->mNumVertices);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    for (uVar10 = 0; uVar10 != 8; uVar10 = uVar10 + 1) {
      if ((paVar4->mTextureCoords[uVar10] != (aiVector3D *)0x0) && (paVar4->mNumVertices != 0)) {
        std::operator+(&local_50,&idstr,"-tex");
        to_string<unsigned_long>(&local_70,uVar10);
        std::operator+(&local_d8,&local_50,&local_70);
        WriteFloatArray(this,&local_d8,(paVar4->mNumUVComponents[uVar10] == 3) + FloatType_TexCoord2
                        ,&paVar4->mTextureCoords[uVar10]->x,(ulong)paVar4->mNumVertices);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    for (uVar10 = 0; uVar10 != 8; uVar10 = uVar10 + 1) {
      if ((paVar4->mColors[uVar10] != (aiColor4D *)0x0) && (paVar4->mNumVertices != 0)) {
        std::operator+(&local_50,&idstr,"-color");
        to_string<unsigned_long>(&local_70,uVar10);
        std::operator+(&local_d8,&local_50,&local_70);
        WriteFloatArray(this,&local_d8,FloatType_Color,&paVar4->mColors[uVar10]->r,
                        (ulong)paVar4->mNumVertices);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar7 = std::operator<<(poVar7,"<vertices id=\"");
    poVar7 = std::operator<<(poVar7,(string *)&geometryId);
    poVar7 = std::operator<<(poVar7,"-vertices");
    poVar7 = std::operator<<(poVar7,"\">");
    std::operator<<(poVar7,(string *)psVar3);
    PushTag(this);
    poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar7 = std::operator<<(poVar7,"<input semantic=\"POSITION\" source=\"#");
    poVar7 = std::operator<<(poVar7,(string *)&geometryId);
    poVar7 = std::operator<<(poVar7,"-positions\" />");
    std::operator<<(poVar7,(string *)psVar3);
    PopTag(this);
    poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar7 = std::operator<<(poVar7,"</vertices>");
    std::operator<<(poVar7,(string *)psVar3);
    iVar9 = 0;
    iVar11 = 0;
    for (lVar8 = 0; (ulong)paVar4->mNumFaces << 4 != lVar8; lVar8 = lVar8 + 0x10) {
      uVar6 = *(uint *)((long)&paVar4->mFaces->mNumIndices + lVar8);
      iVar11 = (iVar11 + 1) - (uint)(uVar6 < 3);
      iVar9 = iVar9 + (uint)(uVar6 == 2);
    }
    if (iVar9 != 0) {
      poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar7 = std::operator<<(poVar7,"<lines count=\"");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
      poVar7 = std::operator<<(poVar7,"\" material=\"defaultMaterial\">");
      std::operator<<(poVar7,(string *)psVar3);
      PushTag(this);
      poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar7 = std::operator<<(poVar7,"<input offset=\"0\" semantic=\"VERTEX\" source=\"#");
      poVar7 = std::operator<<(poVar7,(string *)&geometryId);
      poVar7 = std::operator<<(poVar7,"-vertices\" />");
      std::operator<<(poVar7,(string *)psVar3);
      if ((paVar4->mNormals != (aiVector3D *)0x0) && (paVar4->mNumVertices != 0)) {
        poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
        poVar7 = std::operator<<(poVar7,"<input semantic=\"NORMAL\" source=\"#");
        poVar7 = std::operator<<(poVar7,(string *)&geometryId);
        poVar7 = std::operator<<(poVar7,"-normals\" />");
        std::operator<<(poVar7,(string *)psVar3);
      }
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        if ((paVar4->mTextureCoords[lVar8] != (aiVector3D *)0x0) && (paVar4->mNumVertices != 0)) {
          poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
          poVar7 = std::operator<<(poVar7,"<input semantic=\"TEXCOORD\" source=\"#");
          poVar7 = std::operator<<(poVar7,(string *)&geometryId);
          poVar7 = std::operator<<(poVar7,"-tex");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,"\" ");
          poVar7 = std::operator<<(poVar7,"set=\"");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,"\"");
          poVar7 = std::operator<<(poVar7," />");
          std::operator<<(poVar7,(string *)psVar3);
        }
      }
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        if ((paVar4->mColors[lVar8] != (aiColor4D *)0x0) && (paVar4->mNumVertices != 0)) {
          poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
          poVar7 = std::operator<<(poVar7,"<input semantic=\"COLOR\" source=\"#");
          poVar7 = std::operator<<(poVar7,(string *)&geometryId);
          poVar7 = std::operator<<(poVar7,"-color");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,"\" ");
          poVar7 = std::operator<<(poVar7,"set=\"");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,"\"");
          poVar7 = std::operator<<(poVar7," />");
          std::operator<<(poVar7,(string *)psVar3);
        }
      }
      poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      std::operator<<(poVar7,"<p>");
      for (uVar14 = 0; uVar14 < paVar4->mNumFaces; uVar14 = uVar14 + 1) {
        paVar5 = paVar4->mFaces;
        if (paVar5[uVar14].mNumIndices == 2) {
          uVar13 = 2;
          for (uVar12 = 0; uVar12 < uVar13; uVar12 = uVar12 + 1) {
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
            std::operator<<(poVar7," ");
            uVar13 = (ulong)paVar5[uVar14].mNumIndices;
          }
        }
      }
      poVar7 = std::operator<<((ostream *)puVar1,"</p>");
      std::operator<<(poVar7,(string *)psVar3);
      PopTag(this);
      poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar7 = std::operator<<(poVar7,"</lines>");
      std::operator<<(poVar7,(string *)psVar3);
    }
    if (iVar11 != 0) {
      poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar7 = std::operator<<(poVar7,"<polylist count=\"");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar11);
      poVar7 = std::operator<<(poVar7,"\" material=\"defaultMaterial\">");
      std::operator<<(poVar7,(string *)psVar3);
      PushTag(this);
      poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar7 = std::operator<<(poVar7,"<input offset=\"0\" semantic=\"VERTEX\" source=\"#");
      poVar7 = std::operator<<(poVar7,(string *)&geometryId);
      poVar7 = std::operator<<(poVar7,"-vertices\" />");
      std::operator<<(poVar7,(string *)psVar3);
      if ((paVar4->mNormals != (aiVector3D *)0x0) && (paVar4->mNumVertices != 0)) {
        poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
        poVar7 = std::operator<<(poVar7,"<input offset=\"0\" semantic=\"NORMAL\" source=\"#");
        poVar7 = std::operator<<(poVar7,(string *)&geometryId);
        poVar7 = std::operator<<(poVar7,"-normals\" />");
        std::operator<<(poVar7,(string *)psVar3);
      }
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        if ((paVar4->mTextureCoords[lVar8] != (aiVector3D *)0x0) && (paVar4->mNumVertices != 0)) {
          poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
          poVar7 = std::operator<<(poVar7,"<input offset=\"0\" semantic=\"TEXCOORD\" source=\"#");
          poVar7 = std::operator<<(poVar7,(string *)&geometryId);
          poVar7 = std::operator<<(poVar7,"-tex");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,"\" ");
          poVar7 = std::operator<<(poVar7,"set=\"");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,"\"");
          poVar7 = std::operator<<(poVar7," />");
          std::operator<<(poVar7,(string *)psVar3);
        }
      }
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        if ((paVar4->mColors[lVar8] != (aiColor4D *)0x0) && (paVar4->mNumVertices != 0)) {
          poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
          poVar7 = std::operator<<(poVar7,"<input offset=\"0\" semantic=\"COLOR\" source=\"#");
          poVar7 = std::operator<<(poVar7,(string *)&geometryId);
          poVar7 = std::operator<<(poVar7,"-color");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,"\" ");
          poVar7 = std::operator<<(poVar7,"set=\"");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,"\"");
          poVar7 = std::operator<<(poVar7," />");
          std::operator<<(poVar7,(string *)psVar3);
        }
      }
      poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      std::operator<<(poVar7,"<vcount>");
      lVar8 = 0;
      for (uVar14 = 0; uVar14 < paVar4->mNumFaces; uVar14 = uVar14 + 1) {
        if (2 < *(uint *)((long)&paVar4->mFaces->mNumIndices + lVar8)) {
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
          std::operator<<(poVar7," ");
        }
        lVar8 = lVar8 + 0x10;
      }
      poVar7 = std::operator<<((ostream *)puVar1,"</vcount>");
      std::operator<<(poVar7,(string *)psVar3);
      poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      std::operator<<(poVar7,"<p>");
      for (uVar14 = 0; uVar14 < paVar4->mNumFaces; uVar14 = uVar14 + 1) {
        paVar5 = paVar4->mFaces;
        uVar6 = paVar5[uVar14].mNumIndices;
        if (2 < uVar6) {
          for (uVar13 = 0; uVar13 < uVar6; uVar13 = uVar13 + 1) {
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)puVar1);
            std::operator<<(poVar7," ");
            uVar6 = paVar5[uVar14].mNumIndices;
          }
        }
      }
      poVar7 = std::operator<<((ostream *)puVar1,"</p>");
      std::operator<<(poVar7,(string *)psVar3);
      PopTag(this);
      poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
      poVar7 = std::operator<<(poVar7,"</polylist>");
      std::operator<<(poVar7,(string *)psVar3);
    }
    PopTag(this);
    poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar7 = std::operator<<(poVar7,"</mesh>");
    std::operator<<(poVar7,(string *)psVar3);
    PopTag(this);
    poVar7 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar7 = std::operator<<(poVar7,"</geometry>");
    std::operator<<(poVar7,(string *)psVar3);
  }
  std::__cxx11::string::~string((string *)&geometryId);
  std::__cxx11::string::~string((string *)&geometryName);
  std::__cxx11::string::~string((string *)&idstr);
  return;
}

Assistant:

void ColladaExporter::WriteGeometry( size_t pIndex)
{
    const aiMesh* mesh = mScene->mMeshes[pIndex];
    const std::string idstr = mesh->mName.length == 0 ? GetMeshId(pIndex) : mesh->mName.C_Str();
    const std::string geometryName = XMLEscape(idstr);
    const std::string geometryId = XMLIDEncode(idstr);

    if ( mesh->mNumFaces == 0 || mesh->mNumVertices == 0 )
        return;

    // opening tag
    mOutput << startstr << "<geometry id=\"" << geometryId << "\" name=\"" << geometryName << "\" >" << endstr;
    PushTag();

    mOutput << startstr << "<mesh>" << endstr;
    PushTag();

    // Positions
    WriteFloatArray( idstr + "-positions", FloatType_Vector, (ai_real*) mesh->mVertices, mesh->mNumVertices);
    // Normals, if any
    if( mesh->HasNormals() )
        WriteFloatArray( idstr + "-normals", FloatType_Vector, (ai_real*) mesh->mNormals, mesh->mNumVertices);

    // texture coords
    for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a)
    {
        if( mesh->HasTextureCoords(static_cast<unsigned int>(a)) )
        {
            WriteFloatArray( idstr + "-tex" + to_string(a), mesh->mNumUVComponents[a] == 3 ? FloatType_TexCoord3 : FloatType_TexCoord2,
                (ai_real*) mesh->mTextureCoords[a], mesh->mNumVertices);
        }
    }

    // vertex colors
    for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a)
    {
        if( mesh->HasVertexColors(static_cast<unsigned int>(a)) )
            WriteFloatArray( idstr + "-color" + to_string(a), FloatType_Color, (ai_real*) mesh->mColors[a], mesh->mNumVertices);
    }

    // assemble vertex structure
    // Only write input for POSITION since we will write other as shared inputs in polygon definition
    mOutput << startstr << "<vertices id=\"" << geometryId << "-vertices" << "\">" << endstr;
    PushTag();
    mOutput << startstr << "<input semantic=\"POSITION\" source=\"#" << geometryId << "-positions\" />" << endstr;
    PopTag();
    mOutput << startstr << "</vertices>" << endstr;

    // count the number of lines, triangles and polygon meshes
    int countLines = 0;
    int countPoly = 0;
    for( size_t a = 0; a < mesh->mNumFaces; ++a )
    {
        if (mesh->mFaces[a].mNumIndices == 2) countLines++;
        else if (mesh->mFaces[a].mNumIndices >= 3) countPoly++;
    }

    // lines
    if (countLines)
    {
        mOutput << startstr << "<lines count=\"" << countLines << "\" material=\"defaultMaterial\">" << endstr;
        PushTag();
        mOutput << startstr << "<input offset=\"0\" semantic=\"VERTEX\" source=\"#" << geometryId << "-vertices\" />" << endstr;
        if( mesh->HasNormals() )
            mOutput << startstr << "<input semantic=\"NORMAL\" source=\"#" << geometryId << "-normals\" />" << endstr;
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( mesh->HasTextureCoords(static_cast<unsigned int>(a)) )
                mOutput << startstr << "<input semantic=\"TEXCOORD\" source=\"#" << geometryId << "-tex" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a )
        {
            if( mesh->HasVertexColors(static_cast<unsigned int>(a) ) )
                mOutput << startstr << "<input semantic=\"COLOR\" source=\"#" << geometryId << "-color" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }

        mOutput << startstr << "<p>";
        for( size_t a = 0; a < mesh->mNumFaces; ++a )
        {
            const aiFace& face = mesh->mFaces[a];
            if (face.mNumIndices != 2) continue;
            for( size_t b = 0; b < face.mNumIndices; ++b )
                mOutput << face.mIndices[b] << " ";
        }
        mOutput << "</p>" << endstr;
        PopTag();
        mOutput << startstr << "</lines>" << endstr;
    }

    // triangle - don't use it, because compatibility problems

    // polygons
    if (countPoly)
    {
        mOutput << startstr << "<polylist count=\"" << countPoly << "\" material=\"defaultMaterial\">" << endstr;
        PushTag();
        mOutput << startstr << "<input offset=\"0\" semantic=\"VERTEX\" source=\"#" << geometryId << "-vertices\" />" << endstr;
        if( mesh->HasNormals() )
            mOutput << startstr << "<input offset=\"0\" semantic=\"NORMAL\" source=\"#" << geometryId << "-normals\" />" << endstr;
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( mesh->HasTextureCoords(static_cast<unsigned int>(a)) )
                mOutput << startstr << "<input offset=\"0\" semantic=\"TEXCOORD\" source=\"#" << geometryId << "-tex" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }
        for( size_t a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a )
        {
            if( mesh->HasVertexColors(static_cast<unsigned int>(a) ) )
                mOutput << startstr << "<input offset=\"0\" semantic=\"COLOR\" source=\"#" << geometryId << "-color" << a << "\" " << "set=\"" << a << "\""  << " />" << endstr;
        }

        mOutput << startstr << "<vcount>";
        for( size_t a = 0; a < mesh->mNumFaces; ++a )
        {
            if (mesh->mFaces[a].mNumIndices < 3) continue;
            mOutput << mesh->mFaces[a].mNumIndices << " ";
        }
        mOutput << "</vcount>" << endstr;

        mOutput << startstr << "<p>";
        for( size_t a = 0; a < mesh->mNumFaces; ++a )
        {
            const aiFace& face = mesh->mFaces[a];
            if (face.mNumIndices < 3) continue;
            for( size_t b = 0; b < face.mNumIndices; ++b )
                mOutput << face.mIndices[b] << " ";
        }
        mOutput << "</p>" << endstr;
        PopTag();
        mOutput << startstr << "</polylist>" << endstr;
    }

    // closing tags
    PopTag();
    mOutput << startstr << "</mesh>" << endstr;
    PopTag();
    mOutput << startstr << "</geometry>" << endstr;
}